

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybi13.hpp
# Opt level: O2

error_code __thiscall
websocketpp::processor::hybi13<websocketpp::config::asio>::prepare_close
          (hybi13<websocketpp::config::asio> *this,value code,string *reason,message_ptr *out)

{
  error_category *peVar1;
  undefined6 in_register_00000032;
  error_code eVar2;
  ulong uStack_60;
  string payload;
  __shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
  local_38;
  
  if ((int)CONCAT62(in_register_00000032,code) == 0x3ec || (ushort)(code - 0x3f8) < 0x7c0) {
    peVar1 = error::get_processor_category();
    uStack_60 = 0x18;
  }
  else if ((code == 0x3ed) ||
          (code != 0x3f7 && (0xf05f < (ushort)(code + 0xec78) && 1 < (ushort)(code - 0x3ed)))) {
    if (reason->_M_string_length == 0 || code != 0x3ed) {
      if (reason->_M_string_length < 0x7c) {
        payload._M_dataplus._M_p = (pointer)&payload.field_2;
        payload._M_string_length = 0;
        payload.field_2._M_local_buf[0] = '\0';
        if (code != 0x3ed) {
          std::__cxx11::string::resize((ulong)&payload);
          *payload._M_dataplus._M_p = (char)(code >> 8);
          payload._M_dataplus._M_p[1] = (char)code;
          if (reason->_M_string_length != 0) {
            memmove(payload._M_dataplus._M_p + 2,(reason->_M_dataplus)._M_p,reason->_M_string_length
                   );
          }
        }
        std::
        __shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr(&local_38,
                       &out->
                        super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                      );
        eVar2 = prepare_control(this,CLOSE,&payload,(message_ptr *)&local_38);
        peVar1 = eVar2._M_cat;
        uStack_60 = (ulong)(uint)eVar2._M_value;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
        std::__cxx11::string::~string((string *)&payload);
      }
      else {
        peVar1 = error::get_processor_category();
        uStack_60 = 8;
      }
    }
    else {
      peVar1 = error::get_processor_category();
      uStack_60 = 0x1a;
    }
  }
  else {
    peVar1 = error::get_processor_category();
    uStack_60 = 0x19;
  }
  eVar2._M_cat = peVar1;
  eVar2._0_8_ = uStack_60;
  return eVar2;
}

Assistant:

virtual lib::error_code prepare_close(close::status::value code,
        std::string const & reason, message_ptr out) const
    {
        if (close::status::reserved(code)) {
            return make_error_code(error::reserved_close_code);
        }

        if (close::status::invalid(code) && code != close::status::no_status) {
            return make_error_code(error::invalid_close_code);
        }

        if (code == close::status::no_status && reason.size() > 0) {
            return make_error_code(error::reason_requires_code);
        }

        if (reason.size() > frame:: limits::payload_size_basic-2) {
            return make_error_code(error::control_too_big);
        }

        std::string payload;

        if (code != close::status::no_status) {
            close::code_converter val;
            val.i = htons(code);

            payload.resize(reason.size()+2);

            payload[0] = val.c[0];
            payload[1] = val.c[1];

            std::copy(reason.begin(),reason.end(),payload.begin()+2);
        }

        return this->prepare_control(frame::opcode::CLOSE,payload,out);
    }